

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_addLocalCatalog(PyObject *self,PyObject *args)

{
  PyObject *pPVar1;
  int iVar2;
  undefined8 uVar3;
  PyObject *local_48;
  void *catalogs;
  PyObject *pyobj_ctxt;
  xmlParserCtxtPtr ctxt;
  xmlChar *URL;
  PyObject *args_local;
  PyObject *self_local;
  
  URL = (xmlChar *)args;
  args_local = self;
  iVar2 = _PyArg_ParseTuple_SizeT(args,"Os:addLocalCatalog",&catalogs,&ctxt);
  if (iVar2 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if ((undefined *)catalogs == &_Py_NoneStruct) {
      local_48 = (PyObject *)0x0;
    }
    else {
      local_48 = *(PyObject **)((long)catalogs + 0x10);
    }
    pyobj_ctxt = local_48;
    if (ctxt != (xmlParserCtxtPtr)0x0) {
      uVar3 = xmlCtxtGetCatalogs(local_48);
      pPVar1 = pyobj_ctxt;
      uVar3 = xmlCatalogAddLocal(uVar3,ctxt);
      xmlCtxtSetCatalogs(pPVar1,uVar3);
    }
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    self_local = (PyObject *)&_Py_NoneStruct;
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_addLocalCatalog(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    xmlChar *URL;
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;

    if (!PyArg_ParseTuple(args, (char *)"Os:addLocalCatalog", &pyobj_ctxt, &URL))
        return(NULL);

    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    if (URL != NULL) {
        void *catalogs = xmlCtxtGetCatalogs(ctxt);
        xmlCtxtSetCatalogs(ctxt, xmlCatalogAddLocal(catalogs, URL));
    }

    Py_INCREF(Py_None);
    return (Py_None);
}